

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O2

event_change *
event_changelist_get_or_construct
          (event_changelist *changelist,int fd,short old_events,event_changelist_fdinfo *fdinfo)

{
  long lVar1;
  event_change *ptr;
  int iVar2;
  event_change *peVar3;
  undefined8 uVar4;
  char *pcVar5;
  ulong uVar6;
  
  lVar1 = (long)fdinfo->idxplus1;
  if (lVar1 == 0) {
    iVar2 = changelist->n_changes;
    if (changelist->changes_size < iVar2) {
      pcVar5 = "changelist->n_changes <= changelist->changes_size";
      uVar4 = 0x34c;
      goto LAB_00202709;
    }
    ptr = changelist->changes;
    if (iVar2 == changelist->changes_size) {
      uVar6 = 0x40;
      if (0x3f < iVar2) {
        uVar6 = (ulong)(uint)(iVar2 * 2);
      }
      ptr = (event_change *)event_mm_realloc_(ptr,uVar6 * 0xc);
      if (ptr == (event_change *)0x0) {
        return (event_change *)0x0;
      }
      changelist->changes = ptr;
      changelist->changes_size = (int)uVar6;
      iVar2 = changelist->n_changes;
    }
    changelist->n_changes = iVar2 + 1;
    fdinfo->idxplus1 = iVar2 + 1;
    peVar3 = ptr + iVar2;
    peVar3->old_events = 0;
    peVar3->read_change = '\0';
    peVar3->write_change = '\0';
    peVar3->close_change = '\0';
    *(undefined3 *)&peVar3->field_0x9 = 0;
    peVar3 = ptr + iVar2;
    ptr[iVar2].fd = fd;
    ptr[iVar2].old_events = old_events;
  }
  else {
    if (changelist->changes[lVar1 + -1].fd != fd) {
      pcVar5 = "change->fd == fd";
      uVar4 = 0x35c;
LAB_00202709:
      event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evmap.c"
                 ,uVar4,pcVar5,"event_changelist_get_or_construct");
    }
    peVar3 = changelist->changes + lVar1 + -1;
  }
  return peVar3;
}

Assistant:

static struct event_change *
event_changelist_get_or_construct(struct event_changelist *changelist,
    evutil_socket_t fd,
    short old_events,
    struct event_changelist_fdinfo *fdinfo)
{
	struct event_change *change;

	if (fdinfo->idxplus1 == 0) {
		int idx;
		EVUTIL_ASSERT(changelist->n_changes <= changelist->changes_size);

		if (changelist->n_changes == changelist->changes_size) {
			if (event_changelist_grow(changelist) < 0)
				return NULL;
		}

		idx = changelist->n_changes++;
		change = &changelist->changes[idx];
		fdinfo->idxplus1 = idx + 1;

		memset(change, 0, sizeof(struct event_change));
		change->fd = fd;
		change->old_events = old_events;
	} else {
		change = &changelist->changes[fdinfo->idxplus1 - 1];
		EVUTIL_ASSERT(change->fd == fd);
	}
	return change;
}